

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

void __thiscall slang::ast::ClockingSkew::serializeTo(ClockingSkew *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  int *in_RDI;
  string_view sVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  void *local_38;
  size_t local_30;
  int local_20;
  void *local_18;
  
  if (*in_RDI != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,(char *)in_RDI);
    sVar1 = ast::toString(None);
    local_30 = sVar1._M_len;
    ASTSerializer::write(in_RSI,local_20,local_18,local_30);
  }
  if (*(long *)(in_RDI + 2) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,(char *)in_RDI);
    ASTSerializer::write(in_RSI,(int)in_stack_ffffffffffffffc0,local_38,*(size_t *)(in_RDI + 2));
  }
  return;
}

Assistant:

void ClockingSkew::serializeTo(ASTSerializer& serializer) const {
    if (edge != EdgeKind::None)
        serializer.write("edge", toString(edge));
    if (delay)
        serializer.write("delay", *delay);
}